

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perror.c
# Opt level: O2

PError * p_error_copy(PError *error)

{
  PError *pPVar1;
  
  if (error != (PError *)0x0) {
    pPVar1 = p_error_new_literal(error->code,error->native_code,error->message);
    return pPVar1;
  }
  return (PError *)0x0;
}

Assistant:

P_LIB_API PError *
p_error_copy (const PError *error)
{
	PError *ret;

	if (P_UNLIKELY (error == NULL))
		return NULL;

	if (P_UNLIKELY ((ret = p_error_new_literal (error->code,
						    error->native_code,
						    error->message)) == NULL))
		return NULL;

	return ret;
}